

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

upb_Message * upb_Array_GetMutable(upb_Array *arr,size_t i)

{
  _Bool _Var1;
  size_t sVar2;
  upb_Message *local_30;
  upb_Message *ret;
  char *data;
  size_t elem_size;
  size_t i_local;
  upb_Array *arr_local;
  
  elem_size = i;
  i_local = (size_t)arr;
  sVar2 = upb_Array_Size(arr);
  if (sVar2 <= i) {
    __assert_fail("i < upb_Array_Size(arr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x26,"struct upb_Message *upb_Array_GetMutable(upb_Array *, size_t)");
  }
  data = (char *)0x8;
  sVar2 = _upb_Array_ElemSizeLg2_dont_copy_me__upb_internal_use_only((upb_Array *)i_local);
  if (1 << ((byte)sVar2 & 0x1f) == 8) {
    ret = (upb_Message *)upb_Array_MutableDataPtr((upb_Array *)i_local);
    memcpy(&local_30,
           (anon_union_8_2_9eb4e620_for_upb_Message_0 *)
           ((long)&ret->field_0 + elem_size * (long)data),(size_t)data);
    _Var1 = upb_Message_IsFrozen(local_30);
    if (!_Var1) {
      return local_30;
    }
    __assert_fail("!upb_Message_IsFrozen(ret)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x2c,"struct upb_Message *upb_Array_GetMutable(upb_Array *, size_t)");
  }
  __assert_fail("elem_size == (1 << _upb_Array_ElemSizeLg2_dont_copy_me__upb_internal_use_only(arr))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                ,0x28,"struct upb_Message *upb_Array_GetMutable(upb_Array *, size_t)");
}

Assistant:

upb_Message* upb_Array_GetMutable(upb_Array* arr, size_t i) {
  UPB_ASSERT(i < upb_Array_Size(arr));
  size_t elem_size = sizeof(upb_Message*);
  UPB_ASSERT(elem_size == (1 << UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr)));
  char* data = upb_Array_MutableDataPtr(arr);
  upb_Message* ret;
  memcpy(&ret, data + (i * elem_size), elem_size);
  UPB_ASSERT(!upb_Message_IsFrozen(ret));
  return ret;
}